

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

bool __thiscall YAML::Stream::_ReadAheadTo(Stream *this,size_t i)

{
  iterator *piVar1;
  int iVar2;
  _Map_pointer ppcVar3;
  _Elt_pointer pcVar4;
  char local_19;
  
  iVar2 = *(int *)(this->m_input + *(long *)(*(long *)this->m_input + -0x18) + 0x20);
  do {
    if (iVar2 != 0) {
LAB_00729700:
      local_19 = '\x04';
      pcVar4 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pcVar4 == (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<char,_std::allocator<char>_>::_M_push_back_aux<char>
                  (&this->m_readahead,&local_19);
      }
      else {
        *pcVar4 = '\x04';
        piVar1 = &(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                  super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
LAB_0072972c:
      ppcVar3 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      return i < (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last +
                 (long)((this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur +
                       ((((((ulong)((long)ppcVar3 -
                                   (long)(this->m_readahead).
                                         super__Deque_base<char,_std::allocator<char>_>._M_impl.
                                         super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                         (ulong)(ppcVar3 == (_Map_pointer)0x0)) * 0x200 -
                        (long)(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                              _M_impl.super__Deque_impl_data._M_finish._M_first) -
                       (long)(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                             _M_impl.super__Deque_impl_data._M_start._M_cur));
    }
    ppcVar3 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    if (i < (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_start._M_last +
            (long)((this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur +
                  ((((((ulong)((long)ppcVar3 -
                              (long)(this->m_readahead).
                                    super__Deque_base<char,_std::allocator<char>_>._M_impl.
                                    super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                    (ulong)(ppcVar3 == (_Map_pointer)0x0)) * 0x200 -
                   (long)(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_first) -
                  (long)(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur))) {
      if (iVar2 == 0) goto LAB_0072972c;
      goto LAB_00729700;
    }
    switch(this->m_charSet) {
    case utf8:
      StreamInUtf8(this);
      break;
    case utf16le:
    case utf16be:
      StreamInUtf16(this);
      break;
    case utf32le:
    case utf32be:
      StreamInUtf32(this);
    }
    iVar2 = *(int *)(this->m_input + *(long *)(*(long *)this->m_input + -0x18) + 0x20);
  } while( true );
}

Assistant:

bool Stream::_ReadAheadTo(size_t i) const {
  while (m_input.good() && (m_readahead.size() <= i)) {
    switch (m_charSet) {
      case utf8:
        StreamInUtf8();
        break;
      case utf16le:
        StreamInUtf16();
        break;
      case utf16be:
        StreamInUtf16();
        break;
      case utf32le:
        StreamInUtf32();
        break;
      case utf32be:
        StreamInUtf32();
        break;
    }
  }

  // signal end of stream
  if (!m_input.good())
    m_readahead.push_back(Stream::eof());

  return m_readahead.size() > i;
}